

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint llvm::dwarf::AttributeEncodingVersion(TypeKind ATE)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((byte)(ATE - DW_ATE_address) < 0x12) {
    uVar1 = (&DAT_00e6fa38)[(byte)(ATE - DW_ATE_address)];
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::AttributeEncodingVersion(dwarf::TypeKind ATE) {
  switch (ATE) {
  default:
    return 0;
#define HANDLE_DW_ATE(ID, NAME, VERSION, VENDOR)                               \
  case DW_ATE_##NAME:                                                          \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}